

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validate_decorations.cpp
# Opt level: O2

bool spvtools::val::anon_unknown_0::isMissingOffsetInStruct
               (uint32_t struct_id,ValidationState_t *vstate)

{
  ushort uVar1;
  uint32_t *puVar2;
  bool bVar3;
  Instruction *this;
  set<spvtools::val::Decoration,_std::less<spvtools::val::Decoration>,_std::allocator<spvtools::val::Decoration>_>
  *psVar4;
  _Base_ptr p_Var5;
  uint uVar6;
  ulong *puVar7;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *__range2;
  uint uVar8;
  long lVar9;
  ulong *puVar10;
  ulong uVar11;
  uint32_t *puVar12;
  reference rVar13;
  vector<unsigned_int,_std::allocator<unsigned_int>_> struct_members;
  vector<bool,_std::allocator<bool>_> hasOffset;
  _Vector_base<unsigned_int,_std::allocator<unsigned_int>_> local_40;
  
  this = ValidationState_t::FindDef(vstate,struct_id);
  hasOffset.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
  super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
  hasOffset.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
  super__Bit_iterator_base._M_offset = 0;
  hasOffset.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_finish.
  super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
  hasOffset.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_finish.
  super__Bit_iterator_base._M_offset = 0;
  hasOffset.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
  _M_end_of_storage = (_Bit_pointer)0x0;
  struct_members.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  struct_members.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  struct_members.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  uVar1 = (this->inst_).opcode;
  if (uVar1 - 0x1c < 2) {
    std::vector<bool,_std::allocator<bool>_>::resize(&hasOffset,1,true);
    local_40._M_impl.super__Vector_impl_data._M_start._0_4_ =
         Instruction::GetOperandAs<unsigned_int>(this,1);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::emplace_back<unsigned_int>
              (&struct_members,(uint *)&local_40);
    puVar12 = struct_members.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
              .super__Vector_impl_data._M_start;
    puVar2 = struct_members.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_finish;
  }
  else {
    puVar12 = struct_members.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
              .super__Vector_impl_data._M_start;
    puVar2 = struct_members.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_finish;
    if (uVar1 == 0x1e) {
      getStructMembers((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_40,struct_id,
                       vstate);
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::_M_move_assign
                (&struct_members,&local_40);
      std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base(&local_40);
      std::vector<bool,_std::allocator<bool>_>::resize
                (&hasOffset,
                 (long)struct_members.
                       super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                       super__Vector_impl_data._M_finish -
                 (long)struct_members.
                       super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                       super__Vector_impl_data._M_start >> 2,false);
      psVar4 = ValidationState_t::id_decorations(vstate,struct_id);
      for (p_Var5 = (psVar4->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
          puVar12 = struct_members.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                    _M_impl.super__Vector_impl_data._M_start,
          puVar2 = struct_members.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                   _M_impl.super__Vector_impl_data._M_finish,
          (_Rb_tree_header *)p_Var5 != &(psVar4->_M_t)._M_impl.super__Rb_tree_header;
          p_Var5 = (_Base_ptr)std::_Rb_tree_increment(p_Var5)) {
        if ((p_Var5[1]._M_color == 0x23) && ((long)(int)p_Var5[2]._M_color != 0xffffffffffffffff)) {
          if ((p_Var5[1]._M_parent)->_M_color == ~_S_red) goto LAB_0054263b;
          rVar13 = std::vector<bool,_std::allocator<bool>_>::operator[]
                             (&hasOffset,(long)(int)p_Var5[2]._M_color);
          *rVar13._M_p = *rVar13._M_p | rVar13._M_mask;
        }
      }
    }
  }
  do {
    if (puVar12 == puVar2) {
      lVar9 = (long)((ulong)hasOffset.super__Bvector_base<std::allocator<bool>_>._M_impl.
                            super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_offset +
                    ((long)hasOffset.super__Bvector_base<std::allocator<bool>_>._M_impl.
                           super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_p -
                    (long)hasOffset.super__Bvector_base<std::allocator<bool>_>._M_impl.
                          super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p) * 8) >> 2
      ;
      uVar11 = 0;
      puVar7 = hasOffset.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data
               ._M_start.super__Bit_iterator_base._M_p;
      goto LAB_00542663;
    }
    bVar3 = isMissingOffsetInStruct(*puVar12,vstate);
    puVar12 = puVar12 + 1;
  } while (!bVar3);
LAB_0054263b:
  bVar3 = true;
  goto LAB_005427a0;
LAB_00542663:
  uVar8 = (uint)uVar11;
  if (lVar9 < 1) goto LAB_00542709;
  puVar10 = puVar7;
  uVar6 = uVar8;
  if ((*puVar7 >> (uVar11 & 0x3f) & 1) == 0) goto LAB_00542792;
  puVar10 = puVar7 + (uVar8 == 0x3f);
  uVar11 = (ulong)(uVar8 + 1);
  if (uVar8 == 0x3f) {
    uVar11 = 0;
  }
  uVar6 = (uint)uVar11;
  if ((*puVar10 >> (uVar11 & 0x3f) & 1) == 0) goto LAB_00542792;
  puVar10 = puVar10 + (uVar6 == 0x3f);
  uVar11 = (ulong)(uVar6 + 1);
  if (uVar6 == 0x3f) {
    uVar11 = 0;
  }
  uVar6 = (uint)uVar11;
  if ((*puVar10 >> (uVar11 & 0x3f) & 1) == 0) goto LAB_00542792;
  uVar11 = 0;
  if (uVar6 != 0x3f) {
    uVar11 = (ulong)(uVar6 + 1);
  }
  uVar8 = (uint)uVar11;
  puVar10 = puVar10 + (uVar6 == 0x3f);
  uVar6 = uVar8;
  if ((*puVar10 >> (uVar11 & 0x3f) & 1) == 0) goto LAB_00542792;
  uVar11 = 0;
  if (uVar8 != 0x3f) {
    uVar11 = (ulong)(uVar8 + 1);
  }
  puVar7 = puVar10 + (uVar8 == 0x3f);
  lVar9 = lVar9 + -1;
  goto LAB_00542663;
LAB_00542709:
  lVar9 = (hasOffset.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
           _M_finish.super__Bit_iterator_base._M_offset - uVar11) +
          ((long)hasOffset.super__Bvector_base<std::allocator<bool>_>._M_impl.
                 super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_p - (long)puVar7) *
          8;
  if (lVar9 == 1) {
LAB_00542779:
    puVar10 = puVar7;
    uVar6 = uVar8;
    if ((*puVar7 >> (uVar11 & 0x3f) & 1) != 0) {
      puVar10 = hasOffset.super__Bvector_base<std::allocator<bool>_>._M_impl.
                super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_p;
      uVar6 = hasOffset.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
              _M_finish.super__Bit_iterator_base._M_offset;
    }
  }
  else if (lVar9 == 2) {
LAB_00542756:
    puVar10 = puVar7;
    uVar6 = uVar8;
    if ((*puVar7 >> (uVar11 & 0x3f) & 1) != 0) {
      uVar11 = 0;
      puVar7 = puVar7 + (uVar8 == 0x3f);
      if (uVar8 != 0x3f) {
        uVar11 = (ulong)(uVar8 + 1);
      }
      uVar8 = (uint)uVar11;
      goto LAB_00542779;
    }
  }
  else {
    puVar10 = hasOffset.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
              _M_finish.super__Bit_iterator_base._M_p;
    uVar6 = hasOffset.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
            _M_finish.super__Bit_iterator_base._M_offset;
    if ((lVar9 == 3) && (puVar10 = puVar7, uVar6 = uVar8, (*puVar7 >> (uVar11 & 0x3f) & 1) != 0)) {
      uVar11 = 0;
      puVar7 = puVar7 + (uVar8 == 0x3f);
      if (uVar8 != 0x3f) {
        uVar11 = (ulong)(uVar8 + 1);
      }
      uVar8 = (uint)uVar11;
      goto LAB_00542756;
    }
  }
LAB_00542792:
  bVar3 = uVar6 != hasOffset.super__Bvector_base<std::allocator<bool>_>._M_impl.
                   super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_offset ||
          puVar10 !=
          hasOffset.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
          _M_finish.super__Bit_iterator_base._M_p;
LAB_005427a0:
  std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
            (&struct_members.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>);
  std::_Bvector_base<std::allocator<bool>_>::_M_deallocate
            (&hasOffset.super__Bvector_base<std::allocator<bool>_>);
  return bVar3;
}

Assistant:

bool isMissingOffsetInStruct(uint32_t struct_id, ValidationState_t& vstate) {
  const auto* inst = vstate.FindDef(struct_id);
  std::vector<bool> hasOffset;
  std::vector<uint32_t> struct_members;
  if (inst->opcode() == spv::Op::OpTypeStruct) {
    // Check offsets of member decorations.
    struct_members = getStructMembers(struct_id, vstate);
    hasOffset.resize(struct_members.size(), false);

    for (auto& decoration : vstate.id_decorations(struct_id)) {
      if (spv::Decoration::Offset == decoration.dec_type() &&
          Decoration::kInvalidMember != decoration.struct_member_index()) {
        // Offset 0xffffffff is not valid so ignore it for simplicity's sake.
        if (decoration.params()[0] == 0xffffffff) return true;
        hasOffset[decoration.struct_member_index()] = true;
      }
    }
  } else if (inst->opcode() == spv::Op::OpTypeArray ||
             inst->opcode() == spv::Op::OpTypeRuntimeArray) {
    hasOffset.resize(1, true);
    struct_members.push_back(inst->GetOperandAs<uint32_t>(1u));
  }
  // Look through nested structs (which may be in an array).
  bool nestedStructsMissingOffset = false;
  for (auto id : struct_members) {
    if (isMissingOffsetInStruct(id, vstate)) {
      nestedStructsMissingOffset = true;
      break;
    }
  }
  return nestedStructsMissingOffset ||
         !std::all_of(hasOffset.begin(), hasOffset.end(),
                      [](const bool b) { return b; });
}